

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaUtil.c
# Opt level: O2

Gia_Obj_t * Gia_ObjRecognizeMux(Gia_Obj_t *pNode,Gia_Obj_t **ppNodeT,Gia_Obj_t **ppNodeE)

{
  int iVar1;
  ulong uVar2;
  Gia_Obj_t *pGVar3;
  Gia_Obj_t *pGVar4;
  Gia_Obj_t *pGVar5;
  uint uVar6;
  ulong uVar7;
  uint uVar8;
  uint uVar9;
  Gia_Obj_t *pGVar10;
  
  if (((ulong)pNode & 1) != 0) {
    __assert_fail("!Gia_IsComplement(pNode)",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaUtil.c"
                  ,0x3c2,"Gia_Obj_t *Gia_ObjRecognizeMux(Gia_Obj_t *, Gia_Obj_t **, Gia_Obj_t **)");
  }
  iVar1 = Gia_ObjIsMuxType(pNode);
  if (iVar1 == 0) {
    __assert_fail("Gia_ObjIsMuxType(pNode)",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaUtil.c"
                  ,0x3c3,"Gia_Obj_t *Gia_ObjRecognizeMux(Gia_Obj_t *, Gia_Obj_t **, Gia_Obj_t **)");
  }
  uVar7 = *(ulong *)pNode & 0x1fffffff;
  pGVar5 = pNode + -uVar7;
  uVar2 = *(ulong *)pNode >> 0x20 & 0x1fffffff;
  pGVar3 = pNode + -uVar2;
  uVar7 = *(ulong *)(pNode + -uVar7);
  uVar2 = *(ulong *)(pNode + -uVar2);
  uVar6 = (uint)uVar2;
  uVar8 = (uint)(uVar7 >> 0x20);
  if ((pGVar5 + -(uVar7 >> 0x20 & 0x1fffffff) == pGVar3 + -(uVar2 >> 0x20 & 0x1fffffff)) &&
     (uVar9 = uVar8 >> 0x1d & 1, uVar9 != ((uVar2 >> 0x3d & 1) != 0))) {
    if (uVar9 != 0) {
      *ppNodeT = (Gia_Obj_t *)
                 (((ulong)(uVar6 >> 0x1d & 1) | (ulong)(pGVar3 + -(uVar2 & 0x1fffffff))) ^ 1);
      *ppNodeE = (Gia_Obj_t *)
                 (((ulong)((uint)(*(ulong *)pGVar5 >> 0x1d) & 1) |
                  (ulong)(pGVar5 + -(*(ulong *)pGVar5 & 0x1fffffff))) ^ 1);
      goto LAB_006194fc;
    }
    *ppNodeT = (Gia_Obj_t *)
               (((ulong)((uint)uVar7 >> 0x1d & 1) | (ulong)(pGVar5 + -(uVar7 & 0x1fffffff))) ^ 1);
    pGVar3 = (Gia_Obj_t *)
             ((ulong)((uint)(*(ulong *)pGVar3 >> 0x1d) & 1) |
             (ulong)(pGVar3 + -(*(ulong *)pGVar3 & 0x1fffffff)));
LAB_006193b3:
    *ppNodeE = (Gia_Obj_t *)((ulong)pGVar3 ^ 1);
    pGVar3 = pGVar5;
LAB_006194fc:
    pGVar5 = Gia_ObjChild1(pGVar3);
    return pGVar5;
  }
  pGVar4 = pGVar5 + -(uVar7 & 0x1fffffff);
  pGVar10 = pGVar3 + -(uVar2 & 0x1fffffff);
  if ((pGVar4 == pGVar10) && (((uint)(uVar7 >> 0x1d) & 1) != (uint)((uVar6 >> 0x1d & 1) != 0))) {
    if ((uVar7 >> 0x1d & 1) != 0) {
      pGVar4 = Gia_ObjChild1(pGVar3);
      *ppNodeT = (Gia_Obj_t *)((ulong)pGVar4 ^ 1);
      pGVar5 = Gia_ObjChild1(pGVar5);
      *ppNodeE = (Gia_Obj_t *)((ulong)pGVar5 ^ 1);
      uVar8 = (uint)*(undefined8 *)pGVar3;
      uVar7 = (ulong)(uVar8 & 0x1fffffff);
LAB_006194bc:
      pGVar5 = pGVar3 + -uVar7;
      goto LAB_006194c6;
    }
    pGVar4 = Gia_ObjChild1(pGVar5);
    *ppNodeT = (Gia_Obj_t *)((ulong)pGVar4 ^ 1);
    pGVar3 = Gia_ObjChild1(pGVar3);
    *ppNodeE = (Gia_Obj_t *)((ulong)pGVar3 ^ 1);
    uVar8 = (uint)*(undefined8 *)pGVar5;
    uVar7 = (ulong)(uVar8 & 0x1fffffff);
  }
  else {
    if ((pGVar4 != pGVar3 + -(uVar2 >> 0x20 & 0x1fffffff)) ||
       (((uint)(uVar7 >> 0x1d) & 1) == (uint)((uVar2 >> 0x3d & 1) != 0))) {
      if ((pGVar5 + -(uVar7 >> 0x20 & 0x1fffffff) != pGVar10) ||
         (uVar8 = uVar8 >> 0x1d & 1, uVar8 == ((uVar6 >> 0x1d & 1) != 0))) {
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaUtil.c"
                      ,0x409,
                      "Gia_Obj_t *Gia_ObjRecognizeMux(Gia_Obj_t *, Gia_Obj_t **, Gia_Obj_t **)");
      }
      if (uVar8 == 0) {
        *ppNodeT = (Gia_Obj_t *)(((ulong)((uint)uVar7 >> 0x1d & 1) | (ulong)pGVar4) ^ 1);
        pGVar3 = Gia_ObjChild1(pGVar3);
        goto LAB_006193b3;
      }
      pGVar4 = Gia_ObjChild1(pGVar3);
      *ppNodeT = (Gia_Obj_t *)((ulong)pGVar4 ^ 1);
      *ppNodeE = (Gia_Obj_t *)
                 (((ulong)((uint)(*(ulong *)pGVar5 >> 0x1d) & 1) |
                  (ulong)(pGVar5 + -(*(ulong *)pGVar5 & 0x1fffffff))) ^ 1);
      uVar8 = (uint)*(ulong *)pGVar3;
      uVar7 = *(ulong *)pGVar3 & 0x1fffffff;
      goto LAB_006194bc;
    }
    if ((uVar7 >> 0x1d & 1) != 0) {
      *ppNodeT = (Gia_Obj_t *)(((ulong)(uVar6 >> 0x1d & 1) | (ulong)pGVar10) ^ 1);
      pGVar5 = Gia_ObjChild1(pGVar5);
      *ppNodeE = (Gia_Obj_t *)((ulong)pGVar5 ^ 1);
      goto LAB_006194fc;
    }
    pGVar4 = Gia_ObjChild1(pGVar5);
    *ppNodeT = (Gia_Obj_t *)((ulong)pGVar4 ^ 1);
    *ppNodeE = (Gia_Obj_t *)
               (((ulong)((uint)(*(ulong *)pGVar3 >> 0x1d) & 1) |
                (ulong)(pGVar3 + -(*(ulong *)pGVar3 & 0x1fffffff))) ^ 1);
    uVar8 = (uint)*(ulong *)pGVar5;
    uVar7 = *(ulong *)pGVar5 & 0x1fffffff;
  }
  pGVar5 = pGVar5 + -uVar7;
LAB_006194c6:
  return (Gia_Obj_t *)((ulong)(uVar8 >> 0x1d & 1) | (ulong)pGVar5);
}

Assistant:

Gia_Obj_t * Gia_ObjRecognizeMux( Gia_Obj_t * pNode, Gia_Obj_t ** ppNodeT, Gia_Obj_t ** ppNodeE )
{
    Gia_Obj_t * pNode0, * pNode1;
    assert( !Gia_IsComplement(pNode) );
    assert( Gia_ObjIsMuxType(pNode) );
    // get children
    pNode0 = Gia_ObjFanin0(pNode);
    pNode1 = Gia_ObjFanin1(pNode);

    // find the control variable
    if ( Gia_ObjFanin1(pNode0) == Gia_ObjFanin1(pNode1) && (Gia_ObjFaninC1(pNode0) ^ Gia_ObjFaninC1(pNode1)) )
    {
//        if ( FrGia_IsComplement(pNode1->p2) )
        if ( Gia_ObjFaninC1(pNode0) )
        { // pNode2->p2 is positive phase of C
            *ppNodeT = Gia_Not(Gia_ObjChild0(pNode1));//pNode2->p1);
            *ppNodeE = Gia_Not(Gia_ObjChild0(pNode0));//pNode1->p1);
            return Gia_ObjChild1(pNode1);//pNode2->p2;
        }
        else
        { // pNode1->p2 is positive phase of C
            *ppNodeT = Gia_Not(Gia_ObjChild0(pNode0));//pNode1->p1);
            *ppNodeE = Gia_Not(Gia_ObjChild0(pNode1));//pNode2->p1);
            return Gia_ObjChild1(pNode0);//pNode1->p2;
        }
    }
    else if ( Gia_ObjFanin0(pNode0) == Gia_ObjFanin0(pNode1) && (Gia_ObjFaninC0(pNode0) ^ Gia_ObjFaninC0(pNode1)) )
    {
//        if ( FrGia_IsComplement(pNode1->p1) )
        if ( Gia_ObjFaninC0(pNode0) )
        { // pNode2->p1 is positive phase of C
            *ppNodeT = Gia_Not(Gia_ObjChild1(pNode1));//pNode2->p2);
            *ppNodeE = Gia_Not(Gia_ObjChild1(pNode0));//pNode1->p2);
            return Gia_ObjChild0(pNode1);//pNode2->p1;
        }
        else
        { // pNode1->p1 is positive phase of C
            *ppNodeT = Gia_Not(Gia_ObjChild1(pNode0));//pNode1->p2);
            *ppNodeE = Gia_Not(Gia_ObjChild1(pNode1));//pNode2->p2);
            return Gia_ObjChild0(pNode0);//pNode1->p1;
        }
    }
    else if ( Gia_ObjFanin0(pNode0) == Gia_ObjFanin1(pNode1) && (Gia_ObjFaninC0(pNode0) ^ Gia_ObjFaninC1(pNode1)) )
    {
//        if ( FrGia_IsComplement(pNode1->p1) )
        if ( Gia_ObjFaninC0(pNode0) )
        { // pNode2->p2 is positive phase of C
            *ppNodeT = Gia_Not(Gia_ObjChild0(pNode1));//pNode2->p1);
            *ppNodeE = Gia_Not(Gia_ObjChild1(pNode0));//pNode1->p2);
            return Gia_ObjChild1(pNode1);//pNode2->p2;
        }
        else
        { // pNode1->p1 is positive phase of C
            *ppNodeT = Gia_Not(Gia_ObjChild1(pNode0));//pNode1->p2);
            *ppNodeE = Gia_Not(Gia_ObjChild0(pNode1));//pNode2->p1);
            return Gia_ObjChild0(pNode0);//pNode1->p1;
        }
    }
    else if ( Gia_ObjFanin1(pNode0) == Gia_ObjFanin0(pNode1) && (Gia_ObjFaninC1(pNode0) ^ Gia_ObjFaninC0(pNode1)) )
    {
//        if ( FrGia_IsComplement(pNode1->p2) )
        if ( Gia_ObjFaninC1(pNode0) )
        { // pNode2->p1 is positive phase of C
            *ppNodeT = Gia_Not(Gia_ObjChild1(pNode1));//pNode2->p2);
            *ppNodeE = Gia_Not(Gia_ObjChild0(pNode0));//pNode1->p1);
            return Gia_ObjChild0(pNode1);//pNode2->p1;
        }
        else
        { // pNode1->p2 is positive phase of C
            *ppNodeT = Gia_Not(Gia_ObjChild0(pNode0));//pNode1->p1);
            *ppNodeE = Gia_Not(Gia_ObjChild1(pNode1));//pNode2->p2);
            return Gia_ObjChild1(pNode0);//pNode1->p2;
        }
    }
    assert( 0 ); // this is not MUX
    return NULL;
}